

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int archive_read_format_7zip_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  void *pvVar1;
  size_t sVar2;
  uLong uVar3;
  undefined8 in_R9;
  size_t size_00;
  size_t bytes_to_read;
  uint64_t max_read_size;
  int ret;
  ssize_t bytes;
  _7zip *zip;
  int64_t *offset_local;
  size_t *size_local;
  void **buff_local;
  archive_read *a_local;
  
  max_read_size._4_4_ = 0;
  pvVar1 = a->format->data;
  if (*(int *)((long)pvVar1 + 0x5110) == -1) {
    *(undefined4 *)((long)pvVar1 + 0x5110) = 0;
  }
  if (*(long *)((long)pvVar1 + 0x120) != 0) {
    read_consume(a);
  }
  *offset = *(int64_t *)((long)pvVar1 + 0xb8);
  *size = 0;
  *buff = (void *)0x0;
  if (*(char *)((long)pvVar1 + 0xd0) == '\0') {
    size_00 = 0x1000000;
    if (*(ulong *)((long)pvVar1 + 0xc0) < 0x1000000) {
      size_00 = *(size_t *)((long)pvVar1 + 0xc0);
    }
    sVar2 = read_stream(a,buff,size_00,0);
    a_local._4_4_ = (uInt)sVar2;
    if (-1 < (long)sVar2) {
      if (sVar2 == 0) {
        archive_set_error(&a->archive,0x54,"Truncated 7-Zip file body");
        a_local._4_4_ = 0xffffffe2;
      }
      else {
        *(size_t *)((long)pvVar1 + 0xc0) = *(long *)((long)pvVar1 + 0xc0) - sVar2;
        if (*(long *)((long)pvVar1 + 0xc0) == 0) {
          *(undefined1 *)((long)pvVar1 + 0xd0) = 1;
        }
        if (((*(uint *)(*(long *)((long)pvVar1 + 0xa8) + 0x18) & 8) != 0) && (sVar2 != 0)) {
          uVar3 = cm_zlib_crc32(*(unsigned_long *)((long)pvVar1 + 200),(uchar *)*buff,a_local._4_4_)
          ;
          *(uLong *)((long)pvVar1 + 200) = uVar3;
        }
        if (((*(char *)((long)pvVar1 + 0xd0) != '\0') &&
            ((*(uint *)(*(long *)((long)pvVar1 + 0xa8) + 0x18) & 8) != 0)) &&
           ((ulong)*(uint *)(*(long *)((long)pvVar1 + 0x60) +
                            (ulong)*(uint *)(*(long *)((long)pvVar1 + 0xa8) + 0x14) * 4) !=
            *(ulong *)((long)pvVar1 + 200))) {
          archive_set_error(&a->archive,-1,"7-Zip bad CRC: 0x%lx should be 0x%lx",
                            *(undefined8 *)((long)pvVar1 + 200),
                            (ulong)*(uint *)(*(long *)((long)pvVar1 + 0x60) +
                                            (ulong)*(uint *)(*(long *)((long)pvVar1 + 0xa8) + 0x14)
                                            * 4),in_R9,size_00,0x1000000);
          max_read_size._4_4_ = 0xffffffec;
        }
        *size = sVar2;
        *offset = *(int64_t *)((long)pvVar1 + 0xb8);
        *(size_t *)((long)pvVar1 + 0xb8) = sVar2 + *(long *)((long)pvVar1 + 0xb8);
        a_local._4_4_ = max_read_size._4_4_;
      }
    }
  }
  else {
    a_local._4_4_ = 1;
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_read_format_7zip_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	struct _7zip *zip;
	ssize_t bytes;
	int ret = ARCHIVE_OK;

	zip = (struct _7zip *)(a->format->data);

	if (zip->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		zip->has_encrypted_entries = 0;
	}

	if (zip->pack_stream_bytes_unconsumed)
		read_consume(a);

	*offset = zip->entry_offset;
	*size = 0;
	*buff = NULL;
	/*
	 * If we hit end-of-entry last time, clean up and return
	 * ARCHIVE_EOF this time.
	 */
	if (zip->end_of_entry)
		return (ARCHIVE_EOF);

	const uint64_t max_read_size = 16 * 1024 * 1024;  // Don't try to read more than 16 MB at a time
	size_t bytes_to_read = max_read_size;
	if ((uint64_t)bytes_to_read > zip->entry_bytes_remaining) {
		bytes_to_read = zip->entry_bytes_remaining;
	}
	bytes = read_stream(a, buff, bytes_to_read, 0);
	if (bytes < 0)
		return ((int)bytes);
	if (bytes == 0) {
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated 7-Zip file body");
		return (ARCHIVE_FATAL);
	}
	zip->entry_bytes_remaining -= bytes;
	if (zip->entry_bytes_remaining == 0)
		zip->end_of_entry = 1;

	/* Update checksum */
	if ((zip->entry->flg & CRC32_IS_SET) && bytes)
		zip->entry_crc32 = crc32(zip->entry_crc32, *buff,
		    (unsigned)bytes);

	/* If we hit the end, swallow any end-of-data marker. */
	if (zip->end_of_entry) {
		/* Check computed CRC against file contents. */
		if ((zip->entry->flg & CRC32_IS_SET) &&
			zip->si.ss.digests[zip->entry->ssIndex] !=
		    zip->entry_crc32) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "7-Zip bad CRC: 0x%lx should be 0x%lx",
			    (unsigned long)zip->entry_crc32,
			    (unsigned long)zip->si.ss.digests[
			    		zip->entry->ssIndex]);
			ret = ARCHIVE_WARN;
		}
	}

	*size = bytes;
	*offset = zip->entry_offset;
	zip->entry_offset += bytes;

	return (ret);
}